

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall asl::Array<asl::InetAddress>::free(Array<asl::InetAddress> *this,void *__ptr)

{
  int *piVar1;
  InetAddress *pIVar2;
  long lVar3;
  long lVar4;
  
  pIVar2 = this->_a;
  lVar4 = (long)*(int *)&pIVar2[-1]._data._a;
  if (lVar4 != 0) {
    lVar3 = 0;
    do {
      LOCK();
      piVar1 = (int *)(*(long *)((long)&(pIVar2->_data)._a + lVar3) + -8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        ::free((void *)(*(long *)((long)&(pIVar2->_data)._a + lVar3) + -0x10));
        *(undefined8 *)((long)&(pIVar2->_data)._a + lVar3) = 0;
      }
      lVar3 = lVar3 + 0x10;
    } while (lVar4 * 0x10 != lVar3);
  }
  ::free(this->_a + -1);
  this->_a = (InetAddress *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}